

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c.hpp
# Opt level: O2

size_t __thiscall CodegenC::FunctionTable::look_up(FunctionTable *this,Function *function)

{
  iterator iVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  Function *local_18;
  
  local_18 = function;
  iVar1 = std::
          _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_unsigned_long>,_std::_Select1st<std::pair<const_Function_*const,_unsigned_long>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_unsigned_long>_>_>
          ::find((_Rb_tree<const_Function_*,_std::pair<const_Function_*const,_unsigned_long>,_std::_Select1st<std::pair<const_Function_*const,_unsigned_long>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_unsigned_long>_>_>
                  *)this,&local_18);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->functions)._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = (_Base_ptr)(this->functions)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pmVar2 = std::
             map<const_Function_*,_unsigned_long,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_unsigned_long>_>_>
             ::operator[](&this->functions,&local_18);
    *pmVar2 = (mapped_type)p_Var3;
  }
  else {
    p_Var3 = iVar1._M_node[1]._M_parent;
  }
  return (size_t)p_Var3;
}

Assistant:

std::size_t look_up(const Function* function) {
			auto iterator = functions.find(function);
			if (iterator != functions.end()) {
				return iterator->second;
			}
			const std::size_t index = functions.size();
			functions[function] = index;
			return index;
		}